

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtmidi.cpp
# Opt level: O1

int anon_unknown.dwarf_747b::RtMidi_compiledapis(lua_State *L)

{
  ulong uVar1;
  vector<RtMidi::Api,_std::allocator<RtMidi::Api>_> local_28;
  
  local_28.super__Vector_base<RtMidi::Api,_std::allocator<RtMidi::Api>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_28.super__Vector_base<RtMidi::Api,_std::allocator<RtMidi::Api>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_28.super__Vector_base<RtMidi::Api,_std::allocator<RtMidi::Api>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  RtMidi::getCompiledApi(&local_28);
  lua_createtable(L,(ulong)((long)local_28.
                                  super__Vector_base<RtMidi::Api,_std::allocator<RtMidi::Api>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                           (long)local_28.
                                 super__Vector_base<RtMidi::Api,_std::allocator<RtMidi::Api>_>.
                                 _M_impl.super__Vector_impl_data._M_start) >> 2,0);
  uVar1 = 0;
  while (uVar1 < (ulong)((long)local_28.
                               super__Vector_base<RtMidi::Api,_std::allocator<RtMidi::Api>_>._M_impl
                               .super__Vector_impl_data._M_finish -
                         (long)local_28.
                               super__Vector_base<RtMidi::Api,_std::allocator<RtMidi::Api>_>._M_impl
                               .super__Vector_impl_data._M_start >> 2)) {
    lua_pushinteger(L,local_28.super__Vector_base<RtMidi::Api,_std::allocator<RtMidi::Api>_>._M_impl
                      .super__Vector_impl_data._M_start[uVar1]);
    uVar1 = uVar1 + 1;
    lua_rawseti(L,0xfffffffe,uVar1 & 0xffffffff);
  }
  if (local_28.super__Vector_base<RtMidi::Api,_std::allocator<RtMidi::Api>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_28.super__Vector_base<RtMidi::Api,_std::allocator<RtMidi::Api>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_28.super__Vector_base<RtMidi::Api,_std::allocator<RtMidi::Api>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_28.super__Vector_base<RtMidi::Api,_std::allocator<RtMidi::Api>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return 1;
}

Assistant:

int RtMidi_compiledapis(lua_State *L) {
	auto apis = std::vector<RtMidi::Api> { };
	RtMidi::getCompiledApi(apis);
	lua_createtable(L, apis.size(), 0);
	for (std::size_t i = 0; i < apis.size(); ++i) {
		lua_pushinteger(L, apis[i]);
		lua_rawseti(L, -2, i + 1);
	}
	return 1;
}